

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildHLBVH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,
          atomic<int> *totalNodes,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  int *piVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pMVar7;
  undefined1 auVar8 [16];
  pointer pMVar9;
  pointer pMVar10;
  pointer pMVar11;
  pointer pLVar12;
  pointer pLVar13;
  int pass;
  uint uVar14;
  int iVar15;
  undefined4 extraout_var;
  BVHBuildNode *pBVar16;
  pointer pBVar17;
  ulong uVar18;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *__range1;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *pvVar19;
  pointer pMVar20;
  MortonPrimitive *mp;
  pointer pMVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  BVHBuildNode **__args;
  LBVHTreelet *pLVar25;
  ulong uVar26;
  bool bVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  atomic<int> orderedPrimsOffset;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> finishedTreelets;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> treeletsToBuild;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_2f8;
  undefined8 local_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  BVHAggregate *local_2b8;
  atomic<int> *local_2b0;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_2a8;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_288;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *local_280;
  long *local_278;
  undefined8 uStack_270;
  code *pcStack_268;
  code *pcStack_260;
  void *local_258;
  undefined8 uStack_250;
  code *pcStack_248;
  undefined8 uStack_240;
  _Any_data local_238;
  BVHBuildNode **ppBStack_228;
  code *pcStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> local_138 [11];
  
  auVar29._8_4_ = 0xff7fffff;
  auVar29._0_8_ = 0xff7fffffff7fffff;
  auVar29._12_4_ = 0xff7fffff;
  local_2d8 = 0x7f7fffff7f7fffff;
  uStack_2d0 = 0x7f7fffff;
  uStack_2cc = 0xff7fffff;
  uVar3 = vmovlps_avx(auVar29);
  uStack_2c8 = (undefined4)uVar3;
  uStack_2c4 = (undefined4)((ulong)uVar3 >> 0x20);
  pBVar5 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar6 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar5 != pBVar6) {
    auVar28 = ZEXT464(0x7f7fffff);
    auVar29 = ZEXT816(0x7f7fffff7f7fffff);
    auVar30 = ZEXT464(0xff7fffff);
    auVar31._4_4_ = uStack_2c8;
    auVar31._0_4_ = 0xff7fffff;
    auVar31._8_8_ = 0;
    pBVar17 = pBVar5;
    do {
      auVar32 = ZEXT416((uint)(pBVar17->centroid).super_Tuple3<pbrt::Point3,_float>.z);
      auVar8 = vminss_avx(auVar32,auVar28._0_16_);
      auVar28 = ZEXT1664(auVar8);
      uVar2 = (pBVar17->centroid).super_Tuple3<pbrt::Point3,_float>.x;
      uVar4 = (pBVar17->centroid).super_Tuple3<pbrt::Point3,_float>.y;
      auVar33._4_4_ = uVar4;
      auVar33._0_4_ = uVar2;
      auVar33._8_8_ = 0;
      auVar29 = vminps_avx(auVar33,auVar29);
      auVar31 = vmaxps_avx(auVar33,auVar31);
      auVar32 = vmaxss_avx(auVar32,auVar30._0_16_);
      auVar30 = ZEXT1664(auVar32);
      pBVar17 = pBVar17 + 1;
    } while (pBVar17 != pBVar6);
    local_2d8 = vmovlps_avx(auVar29);
    uVar3 = vmovlps_avx(auVar31);
    uStack_2cc = (undefined4)uVar3;
    uStack_2c8 = (undefined4)((ulong)uVar3 >> 0x20);
    uStack_2d0 = auVar8._0_4_;
    uStack_2c4 = auVar32._0_4_;
  }
  local_2b8 = this;
  local_2b0 = totalNodes;
  local_280 = orderedPrims;
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            (&local_2f8,((long)pBVar6 - (long)pBVar5 >> 4) * -0x5555555555555555,
             (allocator_type *)local_238._M_pod_data);
  pBVar5 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar6 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_258 = (void *)0x0;
  uStack_250 = 0;
  pcStack_248 = (code *)0x0;
  uStack_240 = (code *)0x0;
  local_258 = operator_new(0x18);
  *(vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> **)local_258 = &local_2f8;
  *(vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> **)((long)local_258 + 8) =
       bvhPrimitives;
  *(undefined8 **)((long)local_258 + 0x10) = &local_2d8;
  local_238._M_unused._M_object = &local_258;
  uStack_240 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:405:42)>
               ::_M_invoke;
  pcStack_248 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:405:42)>
                ::_M_manager;
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
                ::_M_invoke;
  ppBStack_228 = (BVHBuildNode **)
                 std::
                 _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
                 ::_M_manager;
  local_288 = bvhPrimitives;
  ParallelFor(0,((long)pBVar6 - (long)pBVar5 >> 4) * -0x5555555555555555,
              (function<void_(long,_long)> *)&local_238);
  if (ppBStack_228 != (BVHBuildNode **)0x0) {
    (*(code *)ppBStack_228)(&local_238,&local_238,3);
  }
  if (pcStack_248 != (code *)0x0) {
    (*pcStack_248)(&local_258,&local_258,3);
  }
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            (&local_2a8,
             (long)local_2f8.
                   super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2f8.
                   super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)local_238._M_pod_data);
  pMVar11 = local_2f8.
            super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  pMVar10 = local_2f8.
            super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pMVar9 = local_2f8.
           super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar14 = 0;
  do {
    bVar27 = (uVar14 & 1) == 0;
    local_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_148 = 0;
    uStack_140 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_198 = 0;
    uStack_190 = 0;
    uStack_188 = 0;
    uStack_180 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1c0 = 0;
    local_238._M_unused._M_object = (void *)0x0;
    local_238._8_8_ = (BVHBuildNode *)0x0;
    ppBStack_228 = (BVHBuildNode **)0x0;
    pcStack_220 = (code *)0x0;
    uStack_218 = 0;
    uStack_210 = 0;
    uStack_208 = 0;
    uStack_200 = 0;
    pvVar19 = &local_2a8;
    if (bVar27) {
      pvVar19 = &local_2f8;
    }
    pMVar20 = (pvVar19->
              super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pvVar19 = &local_2a8;
    if (bVar27) {
      pvVar19 = &local_2f8;
    }
    pMVar7 = (pvVar19->
             super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pMVar21 = pMVar20; pMVar21 != pMVar7; pMVar21 = pMVar21 + 1) {
      piVar1 = (int *)((long)&local_238 +
                      (ulong)(pMVar21->mortonCode >> (uVar14 * 6 & 0x1f) & 0x3f) * 4);
      *piVar1 = *piVar1 + 1;
    }
    local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_138[0].
                          super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    lVar22 = 1;
    iVar23 = 0;
    do {
      iVar23 = iVar23 + *(int *)((long)&uStack_240 + lVar22 * 4 + 4);
      *(int *)((long)&local_138[0].
                      super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar22 * 4) = iVar23;
      lVar22 = lVar22 + 1;
    } while (lVar22 != 0x40);
    for (; pMVar20 != pMVar7; pMVar20 = pMVar20 + 1) {
      uVar18 = (ulong)(pMVar20->mortonCode >> (uVar14 * 6 & 0x1f) & 0x3f);
      iVar23 = *(int *)((long)&local_138[0].
                               super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar18 * 4);
      *(int *)((long)&local_138[0].
                      super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar18 * 4) = iVar23 + 1;
      pvVar19 = &local_2f8;
      if ((uVar14 & 1) == 0) {
        pvVar19 = &local_2a8;
      }
      (pvVar19->super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>).
      _M_impl.super__Vector_impl_data._M_start[iVar23] = *pMVar20;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 5);
  local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2a8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_2a8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_2a8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2a8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_start = pMVar9;
  local_2a8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_finish = pMVar10;
  local_2a8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar11;
  if (pMVar9 != (pointer)0x0) {
    operator_delete(pMVar9,(long)pMVar11 - (long)pMVar9);
  }
  local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_start = (LBVHTreelet *)0x0;
  local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_finish = (LBVHTreelet *)0x0;
  local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (LBVHTreelet *)0x0;
  uVar18 = (ulong)((long)local_2f8.
                         super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_2f8.
                        super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if (0 < (int)uVar18) {
    iVar23 = 0;
    iVar24 = 1;
    uVar26 = 1;
    do {
      if ((uVar26 == (uVar18 & 0xffffffff)) ||
         (((local_2f8.
            super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar26].mortonCode ^
           local_2f8.
           super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>._M_impl
           .super__Vector_impl_data._M_start[iVar23].mortonCode) & 0x3ffc0000) != 0)) {
        iVar15 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                           (alloc.memoryResource,(long)(iVar24 + iVar23 * -2) * 0x38,8);
        local_238._8_8_ = CONCAT44(extraout_var,iVar15);
        iVar15 = (int)uVar26;
        local_238._4_4_ = iVar15 - iVar23;
        local_238._0_4_ = iVar23;
        iVar23 = iVar15;
        if (local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::
          _M_realloc_insert<pbrt::LBVHTreelet>
                    (local_138,
                     (iterator)
                     local_138[0].
                     super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(LBVHTreelet *)&local_238);
        }
        else {
          *(void **)local_138[0].
                    super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                    _M_impl.super__Vector_impl_data._M_finish = local_238._M_unused._M_object;
          (local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
           _M_impl.super__Vector_impl_data._M_finish)->buildNodes = (BVHBuildNode *)local_238._8_8_;
          local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_138[0].
               super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar18 = (ulong)((long)local_2f8.
                             super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2f8.
                            super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
      iVar24 = iVar24 + 2;
      bVar27 = (long)uVar26 < (long)(int)uVar18;
      uVar26 = uVar26 + 1;
    } while (bVar27);
  }
  pLVar13 = local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pLVar12 = local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_2a8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_2a8.
                        super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_278 = (long *)0x0;
  uStack_270 = 0;
  pcStack_268 = (code *)0x0;
  pcStack_260 = (code *)0x0;
  local_278 = (long *)operator_new(0x38);
  *local_278 = (long)local_138;
  local_278[1] = (long)local_2b8;
  local_278[2] = (long)local_288;
  local_278[3] = (long)&local_2f8;
  local_278[4] = (long)local_280;
  local_278[5] = (long)&local_2a8;
  local_278[6] = (long)&local_2b0;
  local_238._M_unused._M_object = &local_278;
  pcStack_260 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:437:44)>
                ::_M_invoke;
  pcStack_268 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:437:44)>
                ::_M_manager;
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
                ::_M_invoke;
  ppBStack_228 = (BVHBuildNode **)
                 std::
                 _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
                 ::_M_manager;
  ParallelFor(0,(long)pLVar13 - (long)pLVar12 >> 4,(function<void_(long,_long)> *)&local_238);
  if (ppBStack_228 != (BVHBuildNode **)0x0) {
    (*(code *)ppBStack_228)(&local_238,&local_238,3);
  }
  if (pcStack_268 != (code *)0x0) {
    (*pcStack_268)(&local_278,&local_278,3);
  }
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = (BVHBuildNode **)0x0;
  ppBStack_228 = (BVHBuildNode **)0x0;
  std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::reserve
            ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)&local_238,
             (long)local_138[0].
                   super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_138[0].
                   super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4);
  pLVar12 = local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    __args = &(local_138[0].
               super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
               super__Vector_impl_data._M_start)->buildNodes;
    do {
      if ((BVHBuildNode **)local_238._8_8_ == ppBStack_228) {
        std::vector<pbrt::BVHBuildNode*,std::allocator<pbrt::BVHBuildNode*>>::
        _M_realloc_insert<pbrt::BVHBuildNode*const&>
                  ((vector<pbrt::BVHBuildNode*,std::allocator<pbrt::BVHBuildNode*>> *)
                   local_238._M_pod_data,(iterator)local_238._8_8_,__args);
      }
      else {
        *(BVHBuildNode **)local_238._8_8_ = *__args;
        local_238._8_8_ = local_238._8_8_ + 8;
      }
      pLVar25 = (LBVHTreelet *)(__args + 1);
      __args = __args + 2;
    } while (pLVar25 != pLVar12);
  }
  pBVar16 = buildUpperSAH(local_2b8,alloc,
                          (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                          &local_238,0,(int)((ulong)(local_238._8_8_ - local_238._0_8_) >> 3),
                          local_2b0);
  if (local_238._M_unused._M_object != (void *)0x0) {
    operator_delete(local_238._M_unused._M_object,(long)ppBStack_228 - local_238._0_8_);
  }
  if (local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
      .super__Vector_impl_data._M_start != (LBVHTreelet *)0x0) {
    operator_delete(local_138[0].
                    super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138[0].
                          super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138[0].
                          super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pBVar16;
}

Assistant:

BVHBuildNode *BVHAggregate::buildHLBVH(Allocator alloc,
                                       const std::vector<BVHPrimitive> &bvhPrimitives,
                                       std::atomic<int> *totalNodes,
                                       std::vector<PrimitiveHandle> &orderedPrims) {
    // Compute bounding box of all primitive centroids
    Bounds3f bounds;
    for (const BVHPrimitive &pi : bvhPrimitives)
        bounds = Union(bounds, pi.centroid);

    // Compute Morton indices of primitives
    std::vector<MortonPrimitive> mortonPrims(bvhPrimitives.size());
    ParallelFor(0, bvhPrimitives.size(), [&](int64_t i) {
        // Initialize _mortonPrims[i]_ for _i_th primitive
        constexpr int mortonBits = 10;
        constexpr int mortonScale = 1 << mortonBits;
        mortonPrims[i].primitiveIndex = bvhPrimitives[i].primitiveIndex;
        Vector3f centroidOffset = bounds.Offset(bvhPrimitives[i].centroid);
        Vector3f offset = centroidOffset * mortonScale;
        mortonPrims[i].mortonCode = EncodeMorton3(offset.x, offset.y, offset.z);
    });

    // Radix sort primitive Morton indices
    RadixSort(&mortonPrims);

    // Create LBVH treelets at bottom of BVH
    // Find intervals of primitives for each treelet
    std::vector<LBVHTreelet> treeletsToBuild;
    for (int start = 0, end = 1; end <= (int)mortonPrims.size(); ++end) {
        uint32_t mask = 0b00111111111111000000000000000000;
        if (end == (int)mortonPrims.size() || ((mortonPrims[start].mortonCode & mask) !=
                                               (mortonPrims[end].mortonCode & mask))) {
            // Add entry to _treeletsToBuild_ for this treelet
            int nPrimitives = end - start;
            int maxBVHNodes = 2 * nPrimitives - 1;
            BVHBuildNode *nodes = alloc.allocate_object<BVHBuildNode>(maxBVHNodes);
            treeletsToBuild.push_back({start, nPrimitives, nodes});

            start = end;
        }
    }

    // Create LBVHs for treelets in parallel
    std::atomic<int> orderedPrimsOffset(0);
    ParallelFor(0, treeletsToBuild.size(), [&](int i) {
        // Generate _i_th LBVH treelet
        int nodesCreated = 0;
        const int firstBitIndex = 29 - 12;
        LBVHTreelet &tr = treeletsToBuild[i];
        tr.buildNodes = emitLBVH(
            tr.buildNodes, bvhPrimitives, &mortonPrims[tr.startIndex], tr.nPrimitives,
            &nodesCreated, orderedPrims, &orderedPrimsOffset, firstBitIndex);
        *totalNodes += nodesCreated;
    });

    // Create and return SAH BVH from LBVH treelets
    std::vector<BVHBuildNode *> finishedTreelets;
    finishedTreelets.reserve(treeletsToBuild.size());
    for (LBVHTreelet &treelet : treeletsToBuild)
        finishedTreelets.push_back(treelet.buildNodes);
    return buildUpperSAH(alloc, finishedTreelets, 0, finishedTreelets.size(), totalNodes);
}